

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O1

void __thiscall GameBoard::GameBoard(GameBoard *this)

{
  int *piVar1;
  long lVar2;
  
  memset(this->gridInfo,0,0x840);
  memset(this->trans,0,0x180);
  this->transCount[0] = 0;
  this->transCount[1] = 0;
  this->maxHeight[0] = 0;
  this->maxHeight[1] = 0;
  this->elimTotal[0] = 0;
  this->elimTotal[1] = 0;
  *(int *)((long)(this->typeCountForColor + 0) + 0) = 0;
  *(int *)((long)(this->typeCountForColor + 0) + 4) = 0;
  *(int *)((long)(this->typeCountForColor + 0) + 8) = 0;
  *(int *)((long)(this->typeCountForColor + 0) + 0xc) = 0;
  *(int *)((long)(this->typeCountForColor + 0) + 0x10) = 0;
  *(int *)((long)(this->typeCountForColor + 0) + 0x14) = 0;
  *(undefined8 *)(this->typeCountForColor[0] + 6) = 0;
  *(int *)((long)(this->typeCountForColor + 1) + 4) = 0;
  *(int *)((long)(this->typeCountForColor + 1) + 8) = 0;
  *(int *)((long)(this->typeCountForColor + 1) + 0xc) = 0;
  *(int *)((long)(this->typeCountForColor + 1) + 0x10) = 0;
  *(int *)((long)(this->typeCountForColor + 1) + 0x14) = 0;
  *(int *)((long)(this->typeCountForColor + 1) + 0x18) = 0;
  lVar2 = -0x420;
  do {
    *(undefined4 *)((long)this->trans[0][0] + lVar2 + 0x2c) = 0xfffffffe;
    *(undefined4 *)((long)this->trans[0][0] + lVar2) = 0xfffffffe;
    *(undefined4 *)((long)this->gridInfo[1][0] + lVar2 + 0x2c) = 0xfffffffe;
    *(undefined4 *)((long)this->gridInfo[1][0] + lVar2) = 0xfffffffe;
    lVar2 = lVar2 + 0x30;
  } while (lVar2 != 0);
  lVar2 = -0xc;
  do {
    piVar1 = this->trans[0][0] + lVar2;
    piVar1[0] = -2;
    piVar1[1] = -2;
    piVar1[2] = -2;
    piVar1[3] = -2;
    piVar1 = this->gridInfo[1][1] + lVar2;
    piVar1[0] = -2;
    piVar1[1] = -2;
    piVar1[2] = -2;
    piVar1[3] = -2;
    piVar1 = this->gridInfo[1][0] + lVar2;
    piVar1[0] = -2;
    piVar1[1] = -2;
    piVar1[2] = -2;
    piVar1[3] = -2;
    piVar1 = this->gridInfo[0][1] + lVar2;
    piVar1[0] = -2;
    piVar1[1] = -2;
    piVar1[2] = -2;
    piVar1[3] = -2;
    lVar2 = lVar2 + 4;
  } while (lVar2 != 0);
  return;
}

Assistant:

GameBoard::GameBoard()
{
    init();
}